

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O2

void M_ParseMenuDefs(void)

{
  TArray<FOptionValues::Pair,_FOptionValues::Pair> *pTVar1;
  undefined8 uVar2;
  EColorRange EVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  FListMenuDescriptor *desc;
  TArray<FOptionValues::Pair,_FOptionValues::Pair> *this;
  FOptionValues **ppFVar8;
  Pair *pPVar9;
  FName optname;
  FName local_16c;
  FString local_168;
  int local_160;
  int lastlump;
  char *local_158;
  FName local_14c;
  FName local_148;
  FName local_144;
  FName local_140;
  FName local_13c;
  FName local_138;
  FName local_134;
  FScanner sc;
  
  lastlump = 0;
  local_134.Index = gameinfo.mTitleColor.Index;
  OptionSettings.mTitleColor = V_FindFontColor(&local_134);
  local_138.Index = gameinfo.mFontColor.Index;
  OptionSettings.mFontColor = V_FindFontColor(&local_138);
  local_13c.Index = gameinfo.mFontColorValue.Index;
  OptionSettings.mFontColorValue = V_FindFontColor(&local_13c);
  local_140.Index = gameinfo.mFontColorMore.Index;
  OptionSettings.mFontColorMore = V_FindFontColor(&local_140);
  local_144.Index = gameinfo.mFontColorHeader.Index;
  OptionSettings.mFontColorHeader = V_FindFontColor(&local_144);
  local_148.Index = gameinfo.mFontColorHighlight.Index;
  OptionSettings.mFontColorHighlight = V_FindFontColor(&local_148);
  local_14c.Index = gameinfo.mFontColorSelection.Index;
  OptionSettings.mFontColorSelection = V_FindFontColor(&local_14c);
  FListMenuDescriptor::Reset(&DefaultListMenuSettings);
  DefaultOptionMenuSettings.mScrollTop = 0;
  DefaultOptionMenuSettings.mIndent = 0;
  DefaultOptionMenuSettings.mPosition = 0;
  DefaultOptionMenuSettings.mDontDim = false;
  addterm(DeinitMenus,"DeinitMenus");
  DeinitMenus();
  local_160 = FWadCollection::CheckNumForName(&Wads,"MENUDEF",0,1,true);
  local_158 = FString::NullString.Nothing;
  do {
    iVar6 = FWadCollection::FindLump(&Wads,"MENUDEF",&lastlump,false);
    if (iVar6 == -1) {
      return;
    }
    FScanner::FScanner(&sc,iVar6);
    mustPrintErrors = local_160 <= iVar6;
    FScanner::SetCMode(&sc,true);
    while (bVar5 = FScanner::GetString(&sc), bVar5) {
      bVar5 = FScanner::Compare(&sc,"LISTMENU");
      if (bVar5) {
        FScanner::MustGetString(&sc);
        desc = (FListMenuDescriptor *)operator_new(0x88);
        (desc->super_FMenuDescriptor).mMenuName.Index = 0;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        (desc->super_FMenuDescriptor).mNetgameMessage.Chars = local_158;
        (desc->super_FMenuDescriptor)._vptr_FMenuDescriptor =
             (_func_int **)&PTR__FListMenuDescriptor_006e7f70;
        (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array = (FListMenuItem **)0x0;
        (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Most = 0;
        (desc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count = 0;
        (desc->super_FMenuDescriptor).mType = 0;
        FName::operator=(&(desc->super_FMenuDescriptor).mMenuName,sc.String);
        desc->mSelectedItem = -1;
        desc->mAutoselect = -1;
        uVar2 = DefaultListMenuSettings._68_8_;
        iVar6 = DefaultListMenuSettings.mSelectOfsY;
        desc->mSelectOfsX = DefaultListMenuSettings.mSelectOfsX;
        uVar4 = DefaultListMenuSettings._68_8_;
        desc->mSelectOfsY = iVar6;
        DefaultListMenuSettings.mSelector.texnum = (int)uVar2;
        DefaultListMenuSettings.mDisplayTop = SUB84(uVar2,4);
        iVar6 = DefaultListMenuSettings.mDisplayTop;
        desc->mSelector = (FTextureID)DefaultListMenuSettings.mSelector.texnum;
        DefaultListMenuSettings._68_8_ = uVar4;
        desc->mDisplayTop = iVar6;
        iVar6 = DefaultListMenuSettings.mYpos;
        desc->mXpos = DefaultListMenuSettings.mXpos;
        desc->mYpos = iVar6;
        desc->mLinespacing = DefaultListMenuSettings.mLinespacing;
        FString::operator=(&(desc->super_FMenuDescriptor).mNetgameMessage,
                           &DefaultListMenuSettings.super_FMenuDescriptor.mNetgameMessage);
        desc->mFont = DefaultListMenuSettings.mFont;
        EVar3 = DefaultListMenuSettings.mFontColor2;
        desc->mFontColor = DefaultListMenuSettings.mFontColor;
        desc->mFontColor2 = EVar3;
        (desc->super_FMenuDescriptor).mClass = (PClass *)0x0;
        desc->mRedirect = (FMenuDescriptor *)0x0;
        desc->mWLeft = 0;
        desc->mWRight = 0;
        desc->mCenter = false;
        ParseListMenuBody(&sc,desc);
        bVar5 = ReplaceMenu(&sc,(FMenuDescriptor *)desc);
        if (bVar5) {
LAB_0033057f:
          (*(desc->super_FMenuDescriptor)._vptr_FMenuDescriptor[1])(desc);
        }
      }
      else {
        bVar5 = FScanner::Compare(&sc,"DEFAULTLISTMENU");
        if (bVar5) {
          ParseListMenuBody(&sc,&DefaultListMenuSettings);
          uVar7 = DefaultListMenuSettings.mItems.super_TArray<FListMenuItem_*,_FListMenuItem_*>.
                  Count;
joined_r0x00330910:
          if (uVar7 != 0) {
            I_FatalError("You cannot add menu items to the menu default settings.");
          }
        }
        else {
          bVar5 = FScanner::Compare(&sc,"OPTIONVALUE");
          if (bVar5) {
            optname.Index = 0;
            this = (TArray<FOptionValues::Pair,_FOptionValues::Pair> *)operator_new(0x10);
            this->Array = (Pair *)0x0;
            this->Most = 0;
            this->Count = 0;
            FScanner::MustGetString(&sc);
            FName::operator=(&optname,sc.String);
            FScanner::MustGetStringName(&sc,"{");
            while (bVar5 = FScanner::CheckString(&sc,"}"), !bVar5) {
              uVar7 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Reserve(this,1);
              pPVar9 = this->Array;
              FScanner::MustGetFloat(&sc);
              pPVar9[uVar7].Value = sc.Float;
              FScanner::MustGetStringName(&sc,",");
              FScanner::MustGetString(&sc);
              strbin1((char *)&local_168);
              FString::operator=(&pPVar9[uVar7].Text,&local_168);
              FString::~FString(&local_168);
            }
            local_168.Chars._0_4_ = optname.Index;
            ppFVar8 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>
                      ::CheckKey(&OptionValues,(FName *)&local_168);
            if ((ppFVar8 != (FOptionValues **)0x0) &&
               (pTVar1 = &(*ppFVar8)->mValues,
               pTVar1 != (TArray<FOptionValues::Pair,_FOptionValues::Pair> *)0x0)) {
              TArray<FOptionValues::Pair,_FOptionValues::Pair>::~TArray(pTVar1);
              operator_delete(pTVar1,0x10);
            }
            local_16c.Index = optname.Index;
            ppFVar8 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>
                      ::operator[](&OptionValues,&local_16c);
LAB_00330831:
            *ppFVar8 = (FOptionValues *)this;
          }
          else {
            bVar5 = FScanner::Compare(&sc,"OPTIONSTRING");
            if (bVar5) {
              optname.Index = 0;
              this = (TArray<FOptionValues::Pair,_FOptionValues::Pair> *)operator_new(0x10);
              this->Array = (Pair *)0x0;
              this->Most = 0;
              this->Count = 0;
              FScanner::MustGetString(&sc);
              FName::operator=(&optname,sc.String);
              FScanner::MustGetStringName(&sc,"{");
              while (bVar5 = FScanner::CheckString(&sc,"}"), !bVar5) {
                uVar7 = TArray<FOptionValues::Pair,_FOptionValues::Pair>::Reserve(this,1);
                pPVar9 = this->Array + uVar7;
                FScanner::MustGetString(&sc);
                pPVar9->Value = 1.79769313486232e+308;
                FString::operator=(&pPVar9->TextValue,sc.String);
                FScanner::MustGetStringName(&sc,",");
                FScanner::MustGetString(&sc);
                strbin1((char *)&local_168);
                FString::operator=(&pPVar9->Text,&local_168);
                FString::~FString(&local_168);
              }
              local_168.Chars._0_4_ = optname.Index;
              ppFVar8 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>
                        ::CheckKey(&OptionValues,(FName *)&local_168);
              if ((ppFVar8 != (FOptionValues **)0x0) &&
                 (pTVar1 = &(*ppFVar8)->mValues,
                 pTVar1 != (TArray<FOptionValues::Pair,_FOptionValues::Pair> *)0x0)) {
                TArray<FOptionValues::Pair,_FOptionValues::Pair>::~TArray(pTVar1);
                operator_delete(pTVar1,0x10);
              }
              local_16c.Index = optname.Index;
              ppFVar8 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>
                        ::operator[](&OptionValues,&local_16c);
              goto LAB_00330831;
            }
            bVar5 = FScanner::Compare(&sc,"OPTIONMENUSETTINGS");
            if (bVar5) {
              ParseOptionSettings(&sc);
            }
            else {
              bVar5 = FScanner::Compare(&sc,"OPTIONMENU");
              if (bVar5) {
                FScanner::MustGetString(&sc);
                desc = (FListMenuDescriptor *)operator_new(0x60);
                FOptionMenuDescriptor::FOptionMenuDescriptor((FOptionMenuDescriptor *)desc);
                (desc->super_FMenuDescriptor).mType = 1;
                FName::operator=(&(desc->super_FMenuDescriptor).mMenuName,sc.String);
                desc->mSelectOfsY = -1;
                desc->mXpos = 0;
                (desc->super_FMenuDescriptor).mClass = (PClass *)0x0;
                desc->mDisplayTop = DefaultOptionMenuSettings.mScrollTop;
                iVar6 = DefaultOptionMenuSettings.mPosition;
                desc->mYpos = DefaultOptionMenuSettings.mIndent;
                desc->mWLeft = iVar6;
                *(bool *)&desc->mWRight = DefaultOptionMenuSettings.mDontDim;
                ParseOptionMenuBody(&sc,(FOptionMenuDescriptor *)desc);
                bVar5 = ReplaceMenu(&sc,(FMenuDescriptor *)desc);
                if (desc->mYpos == 0) {
                  FOptionMenuDescriptor::CalcIndent((FOptionMenuDescriptor *)desc);
                }
                if (bVar5) goto LAB_0033057f;
              }
              else {
                bVar5 = FScanner::Compare(&sc,"DEFAULTOPTIONMENU");
                if (bVar5) {
                  ParseOptionMenuBody(&sc,&DefaultOptionMenuSettings);
                  uVar7 = DefaultOptionMenuSettings.mItems.
                          super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
                  goto joined_r0x00330910;
                }
                FScanner::ScriptError(&sc,"Unknown keyword \'%s\'",sc.String);
              }
            }
          }
        }
      }
    }
    FScanner::~FScanner(&sc);
  } while( true );
}

Assistant:

void M_ParseMenuDefs()
{
	int lump, lastlump = 0;

	OptionSettings.mTitleColor = V_FindFontColor(gameinfo.mTitleColor);
	OptionSettings.mFontColor = V_FindFontColor(gameinfo.mFontColor);
	OptionSettings.mFontColorValue = V_FindFontColor(gameinfo.mFontColorValue);
	OptionSettings.mFontColorMore = V_FindFontColor(gameinfo.mFontColorMore);
	OptionSettings.mFontColorHeader = V_FindFontColor(gameinfo.mFontColorHeader);
	OptionSettings.mFontColorHighlight = V_FindFontColor(gameinfo.mFontColorHighlight);
	OptionSettings.mFontColorSelection = V_FindFontColor(gameinfo.mFontColorSelection);
	DefaultListMenuSettings.Reset();
	DefaultOptionMenuSettings.Reset();

	atterm(	DeinitMenus);
	DeinitMenus();

	int IWADMenu = Wads.CheckNumForName("MENUDEF", ns_global, FWadCollection::IWAD_FILENUM);

	while ((lump = Wads.FindLump ("MENUDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);

		mustPrintErrors = lump >= IWADMenu;
		sc.SetCMode(true);
		while (sc.GetString())
		{
			if (sc.Compare("LISTMENU"))
			{
				ParseListMenu(sc);
			}
			else if (sc.Compare("DEFAULTLISTMENU"))
			{
				ParseListMenuBody(sc, &DefaultListMenuSettings);
				if (DefaultListMenuSettings.mItems.Size() > 0)
				{
					I_FatalError("You cannot add menu items to the menu default settings.");
				}
			}
			else if (sc.Compare("OPTIONVALUE"))
			{
				ParseOptionValue(sc);
			}
			else if (sc.Compare("OPTIONSTRING"))
			{
				ParseOptionString(sc);
			}
			else if (sc.Compare("OPTIONMENUSETTINGS"))
			{
				ParseOptionSettings(sc);
			}
			else if (sc.Compare("OPTIONMENU"))
			{
				ParseOptionMenu(sc);
			}
			else if (sc.Compare("DEFAULTOPTIONMENU"))
			{
				ParseOptionMenuBody(sc, &DefaultOptionMenuSettings);
				if (DefaultOptionMenuSettings.mItems.Size() > 0)
				{
					I_FatalError("You cannot add menu items to the menu default settings.");
				}
			}
			else
			{
				sc.ScriptError("Unknown keyword '%s'", sc.String);
			}
		}
	}
}